

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O1

cram_block * cram_encode_slice_header(cram_fd *fd,cram_slice *s)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  cram_block *b;
  byte *pbVar6;
  long lVar7;
  cram_block_slice_hdr *pcVar8;
  int32_t iVar9;
  long lVar10;
  byte *pbVar11;
  
  b = cram_new_block(MAPPED_SLICE,0);
  if (b == (cram_block *)0x0) {
    return (cram_block *)0x0;
  }
  pcVar8 = s->hdr;
  pbVar6 = (byte *)malloc((long)(pcVar8->num_blocks * 5 + 0x38));
  if (pbVar6 == (byte *)0x0) {
    cram_free_block(b);
    return (cram_block *)0x0;
  }
  uVar1 = pcVar8->ref_seq_id;
  if (uVar1 < 0x80) {
    *pbVar6 = (byte)uVar1;
    lVar10 = 1;
  }
  else if (uVar1 < 0x4000) {
    *pbVar6 = (byte)(uVar1 >> 8) | 0x80;
    pbVar6[1] = (byte)pcVar8->ref_seq_id;
    lVar10 = 2;
  }
  else if (uVar1 < 0x200000) {
    *pbVar6 = (byte)(uVar1 >> 0x10) | 0xc0;
    pbVar6[1] = *(byte *)((long)&pcVar8->ref_seq_id + 1);
    pbVar6[2] = (byte)pcVar8->ref_seq_id;
    lVar10 = 3;
  }
  else {
    bVar4 = (byte)(uVar1 >> 0x18);
    if (uVar1 < 0x10000000) {
      *pbVar6 = bVar4 | 0xe0;
      pbVar6[1] = *(byte *)((long)&pcVar8->ref_seq_id + 2);
      pbVar6[2] = *(byte *)((long)&pcVar8->ref_seq_id + 1);
      pbVar6[3] = (byte)pcVar8->ref_seq_id;
      lVar10 = 4;
    }
    else {
      *pbVar6 = bVar4 >> 4 | 0xf0;
      pbVar6[1] = (byte)((uint)pcVar8->ref_seq_id >> 0x14);
      pbVar6[2] = (byte)((uint)pcVar8->ref_seq_id >> 0xc);
      pbVar6[3] = (byte)((uint)pcVar8->ref_seq_id >> 4);
      pbVar6[4] = (byte)pcVar8->ref_seq_id & 0xf;
      lVar10 = 5;
    }
  }
  pbVar11 = pbVar6 + lVar10;
  uVar1 = pcVar8->ref_seq_start;
  if (uVar1 < 0x80) {
    *pbVar11 = (byte)uVar1;
    lVar10 = 1;
  }
  else if (uVar1 < 0x4000) {
    *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
    pbVar11[1] = (byte)pcVar8->ref_seq_start;
    lVar10 = 2;
  }
  else if (uVar1 < 0x200000) {
    *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
    pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_start + 1);
    pbVar11[2] = (byte)pcVar8->ref_seq_start;
    lVar10 = 3;
  }
  else {
    bVar4 = (byte)(uVar1 >> 0x18);
    if (uVar1 < 0x10000000) {
      *pbVar11 = bVar4 | 0xe0;
      pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_start + 2);
      pbVar11[2] = *(byte *)((long)&pcVar8->ref_seq_start + 1);
      pbVar11[3] = (byte)pcVar8->ref_seq_start;
      lVar10 = 4;
    }
    else {
      *pbVar11 = bVar4 >> 4 | 0xf0;
      pbVar11[1] = (byte)((uint)pcVar8->ref_seq_start >> 0x14);
      pbVar11[2] = (byte)((uint)pcVar8->ref_seq_start >> 0xc);
      pbVar11[3] = (byte)((uint)pcVar8->ref_seq_start >> 4);
      pbVar11[4] = (byte)pcVar8->ref_seq_start & 0xf;
      lVar10 = 5;
    }
  }
  pbVar11 = pbVar11 + lVar10;
  uVar1 = pcVar8->ref_seq_span;
  if (uVar1 < 0x80) {
    *pbVar11 = (byte)uVar1;
    lVar10 = 1;
  }
  else if (uVar1 < 0x4000) {
    *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
    pbVar11[1] = (byte)pcVar8->ref_seq_span;
    lVar10 = 2;
  }
  else if (uVar1 < 0x200000) {
    *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
    pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_span + 1);
    pbVar11[2] = (byte)pcVar8->ref_seq_span;
    lVar10 = 3;
  }
  else {
    bVar4 = (byte)(uVar1 >> 0x18);
    if (uVar1 < 0x10000000) {
      *pbVar11 = bVar4 | 0xe0;
      pbVar11[1] = *(byte *)((long)&pcVar8->ref_seq_span + 2);
      pbVar11[2] = *(byte *)((long)&pcVar8->ref_seq_span + 1);
      pbVar11[3] = (byte)pcVar8->ref_seq_span;
      lVar10 = 4;
    }
    else {
      *pbVar11 = bVar4 >> 4 | 0xf0;
      pbVar11[1] = (byte)((uint)pcVar8->ref_seq_span >> 0x14);
      pbVar11[2] = (byte)((uint)pcVar8->ref_seq_span >> 0xc);
      pbVar11[3] = (byte)((uint)pcVar8->ref_seq_span >> 4);
      pbVar11[4] = (byte)pcVar8->ref_seq_span & 0xf;
      lVar10 = 5;
    }
  }
  pbVar11 = pbVar11 + lVar10;
  uVar1 = pcVar8->num_records;
  if (uVar1 < 0x80) {
    *pbVar11 = (byte)uVar1;
    lVar10 = 1;
  }
  else if (uVar1 < 0x4000) {
    *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
    pbVar11[1] = (byte)pcVar8->num_records;
    lVar10 = 2;
  }
  else if (uVar1 < 0x200000) {
    *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
    pbVar11[1] = *(byte *)((long)&pcVar8->num_records + 1);
    pbVar11[2] = (byte)pcVar8->num_records;
    lVar10 = 3;
  }
  else {
    bVar4 = (byte)(uVar1 >> 0x18);
    if (uVar1 < 0x10000000) {
      *pbVar11 = bVar4 | 0xe0;
      pbVar11[1] = *(byte *)((long)&pcVar8->num_records + 2);
      pbVar11[2] = *(byte *)((long)&pcVar8->num_records + 1);
      pbVar11[3] = (byte)pcVar8->num_records;
      lVar10 = 4;
    }
    else {
      *pbVar11 = bVar4 >> 4 | 0xf0;
      pbVar11[1] = (byte)((uint)pcVar8->num_records >> 0x14);
      pbVar11[2] = (byte)((uint)pcVar8->num_records >> 0xc);
      pbVar11[3] = (byte)((uint)pcVar8->num_records >> 4);
      pbVar11[4] = (byte)pcVar8->num_records & 0xf;
      lVar10 = 5;
    }
  }
  pbVar11 = pbVar11 + lVar10;
  iVar5 = fd->version >> 8;
  if (iVar5 == 2) {
    uVar2 = pcVar8->record_counter;
    if (uVar2 < 0x80) {
      *pbVar11 = (byte)uVar2;
      lVar10 = 1;
    }
    else if (uVar2 < 0x4000) {
      *pbVar11 = (byte)(uVar2 >> 8) | 0x80;
      pbVar11[1] = (byte)pcVar8->record_counter;
      lVar10 = 2;
    }
    else if (uVar2 < 0x200000) {
      *pbVar11 = (byte)(uVar2 >> 0x10) | 0xc0;
      pbVar11[1] = *(byte *)((long)&pcVar8->record_counter + 1);
      pbVar11[2] = (byte)pcVar8->record_counter;
      lVar10 = 3;
    }
    else {
      bVar4 = (byte)(uVar2 >> 0x18);
      if (uVar2 < 0x10000000) {
        *pbVar11 = bVar4 | 0xe0;
        pbVar11[1] = *(byte *)((long)&pcVar8->record_counter + 2);
        pbVar11[2] = *(byte *)((long)&pcVar8->record_counter + 1);
        pbVar11[3] = (byte)pcVar8->record_counter;
        lVar10 = 4;
      }
      else {
        *pbVar11 = bVar4 >> 4 | 0xf0;
        pbVar11[1] = (byte)((uint)pcVar8->record_counter >> 0x14);
        pbVar11[2] = (byte)((uint)pcVar8->record_counter >> 0xc);
        pbVar11[3] = (byte)((uint)pcVar8->record_counter >> 4);
        pbVar11[4] = (byte)pcVar8->record_counter & 0xf;
        lVar10 = 5;
      }
    }
  }
  else {
    if (iVar5 < 3) goto LAB_00123f8a;
    iVar5 = ltf8_put((char *)pbVar11,pcVar8->record_counter);
    lVar10 = (long)iVar5;
  }
  pbVar11 = pbVar11 + lVar10;
LAB_00123f8a:
  pcVar8 = s->hdr;
  uVar1 = pcVar8->num_blocks;
  if (uVar1 < 0x80) {
    *pbVar11 = (byte)uVar1;
    lVar10 = 1;
  }
  else if (uVar1 < 0x4000) {
    *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
    pbVar11[1] = (byte)pcVar8->num_blocks;
    lVar10 = 2;
  }
  else if (uVar1 < 0x200000) {
    *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
    pbVar11[1] = *(byte *)((long)&pcVar8->num_blocks + 1);
    pbVar11[2] = (byte)pcVar8->num_blocks;
    lVar10 = 3;
  }
  else {
    bVar4 = (byte)(uVar1 >> 0x18);
    if (uVar1 < 0x10000000) {
      *pbVar11 = bVar4 | 0xe0;
      pbVar11[1] = *(byte *)((long)&pcVar8->num_blocks + 2);
      pbVar11[2] = *(byte *)((long)&pcVar8->num_blocks + 1);
      pbVar11[3] = (byte)pcVar8->num_blocks;
      lVar10 = 4;
    }
    else {
      *pbVar11 = bVar4 >> 4 | 0xf0;
      pbVar11[1] = (byte)((uint)pcVar8->num_blocks >> 0x14);
      pbVar11[2] = (byte)((uint)pcVar8->num_blocks >> 0xc);
      pbVar11[3] = (byte)((uint)pcVar8->num_blocks >> 4);
      pbVar11[4] = (byte)pcVar8->num_blocks & 0xf;
      lVar10 = 5;
    }
  }
  pbVar11 = pbVar11 + lVar10;
  uVar1 = pcVar8->num_content_ids;
  if (uVar1 < 0x80) {
    *pbVar11 = (byte)uVar1;
    lVar10 = 1;
  }
  else if (uVar1 < 0x4000) {
    *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
    pbVar11[1] = (byte)pcVar8->num_content_ids;
    lVar10 = 2;
  }
  else if (uVar1 < 0x200000) {
    *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
    pbVar11[1] = *(byte *)((long)&pcVar8->num_content_ids + 1);
    pbVar11[2] = (byte)pcVar8->num_content_ids;
    lVar10 = 3;
  }
  else {
    bVar4 = (byte)(uVar1 >> 0x18);
    if (uVar1 < 0x10000000) {
      *pbVar11 = bVar4 | 0xe0;
      pbVar11[1] = *(byte *)((long)&pcVar8->num_content_ids + 2);
      pbVar11[2] = *(byte *)((long)&pcVar8->num_content_ids + 1);
      pbVar11[3] = (byte)pcVar8->num_content_ids;
      lVar10 = 4;
    }
    else {
      *pbVar11 = bVar4 >> 4 | 0xf0;
      pbVar11[1] = (byte)((uint)pcVar8->num_content_ids >> 0x14);
      pbVar11[2] = (byte)((uint)pcVar8->num_content_ids >> 0xc);
      pbVar11[3] = (byte)((uint)pcVar8->num_content_ids >> 4);
      pbVar11[4] = (byte)pcVar8->num_content_ids & 0xf;
      lVar10 = 5;
    }
  }
  pbVar11 = pbVar11 + lVar10;
  pcVar8 = s->hdr;
  if (0 < pcVar8->num_content_ids) {
    lVar10 = 0;
    do {
      uVar1 = pcVar8->block_content_ids[lVar10];
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lVar7 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = *(byte *)(s->hdr->block_content_ids + lVar10);
        lVar7 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)s->hdr->block_content_ids + lVar10 * 4 + 1);
        pbVar11[2] = *(byte *)(s->hdr->block_content_ids + lVar10);
        lVar7 = 3;
      }
      else {
        bVar4 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar4 | 0xe0;
          pbVar11[1] = *(byte *)((long)s->hdr->block_content_ids + lVar10 * 4 + 2);
          pbVar11[2] = *(byte *)((long)s->hdr->block_content_ids + lVar10 * 4 + 1);
          pbVar11[3] = *(byte *)(s->hdr->block_content_ids + lVar10);
          lVar7 = 4;
        }
        else {
          *pbVar11 = bVar4 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)s->hdr->block_content_ids[lVar10] >> 0x14);
          pbVar11[2] = (byte)((uint)s->hdr->block_content_ids[lVar10] >> 0xc);
          pbVar11[3] = (byte)((uint)s->hdr->block_content_ids[lVar10] >> 4);
          pbVar11[4] = *(byte *)(s->hdr->block_content_ids + lVar10) & 0xf;
          lVar7 = 5;
        }
      }
      pbVar11 = pbVar11 + lVar7;
      lVar10 = lVar10 + 1;
      pcVar8 = s->hdr;
    } while (lVar10 < pcVar8->num_content_ids);
  }
  if (pcVar8->content_type == MAPPED_SLICE) {
    uVar1 = pcVar8->ref_base_id;
    if (uVar1 < 0x80) {
      *pbVar11 = (byte)uVar1;
      lVar10 = 1;
    }
    else if (uVar1 < 0x4000) {
      *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
      pbVar11[1] = (byte)s->hdr->ref_base_id;
      lVar10 = 2;
    }
    else if (uVar1 < 0x200000) {
      *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
      pbVar11[1] = *(byte *)((long)&s->hdr->ref_base_id + 1);
      pbVar11[2] = (byte)s->hdr->ref_base_id;
      lVar10 = 3;
    }
    else {
      bVar4 = (byte)(uVar1 >> 0x18);
      if (uVar1 < 0x10000000) {
        *pbVar11 = bVar4 | 0xe0;
        pbVar11[1] = *(byte *)((long)&s->hdr->ref_base_id + 2);
        pbVar11[2] = *(byte *)((long)&s->hdr->ref_base_id + 1);
        pbVar11[3] = (byte)s->hdr->ref_base_id;
        lVar10 = 4;
      }
      else {
        *pbVar11 = bVar4 >> 4 | 0xf0;
        pbVar11[1] = (byte)((uint)s->hdr->ref_base_id >> 0x14);
        pbVar11[2] = (byte)((uint)s->hdr->ref_base_id >> 0xc);
        pbVar11[3] = (byte)((uint)s->hdr->ref_base_id >> 4);
        pbVar11[4] = (byte)s->hdr->ref_base_id & 0xf;
        lVar10 = 5;
      }
    }
    pbVar11 = pbVar11 + lVar10;
  }
  if ((fd->version & 0xffffff00U) != 0x100) {
    uVar3 = *(undefined8 *)(s->hdr->md5 + 8);
    *(undefined8 *)pbVar11 = *(undefined8 *)s->hdr->md5;
    *(undefined8 *)(pbVar11 + 8) = uVar3;
    pbVar11 = pbVar11 + 0x10;
  }
  if ((long)(s->hdr->num_blocks * 5 + 0x38) < (long)pbVar11 - (long)pbVar6) {
    __assert_fail("cp-buf <= 16+5*(8+s->hdr->num_blocks)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_encode.c"
                  ,0x2c1,"cram_block *cram_encode_slice_header(cram_fd *, cram_slice *)");
  }
  b->data = pbVar6;
  iVar9 = (int32_t)((long)pbVar11 - (long)pbVar6);
  b->uncomp_size = iVar9;
  b->comp_size = iVar9;
  return b;
}

Assistant:

cram_block *cram_encode_slice_header(cram_fd *fd, cram_slice *s) {
    char *buf;
    char *cp;
    cram_block *b = cram_new_block(MAPPED_SLICE, 0);
    int j;

    if (!b)
	return NULL;

    if (NULL == (cp = buf = malloc(16+5*(8+s->hdr->num_blocks)))) {
	cram_free_block(b);
	return NULL;
    }

    cp += itf8_put(cp, s->hdr->ref_seq_id);
    cp += itf8_put(cp, s->hdr->ref_seq_start);
    cp += itf8_put(cp, s->hdr->ref_seq_span);
    cp += itf8_put(cp, s->hdr->num_records);
    if (CRAM_MAJOR_VERS(fd->version) == 2)
	cp += itf8_put(cp, s->hdr->record_counter);
    else if (CRAM_MAJOR_VERS(fd->version) >= 3)
	cp += ltf8_put(cp, s->hdr->record_counter);
    cp += itf8_put(cp, s->hdr->num_blocks);
    cp += itf8_put(cp, s->hdr->num_content_ids);
    for (j = 0; j < s->hdr->num_content_ids; j++) {
	cp += itf8_put(cp, s->hdr->block_content_ids[j]);
    }
    if (s->hdr->content_type == MAPPED_SLICE)
	cp += itf8_put(cp, s->hdr->ref_base_id);

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(cp, s->hdr->md5, 16); cp += 16;
    }
    
    assert(cp-buf <= 16+5*(8+s->hdr->num_blocks));

    b->data = (unsigned char *)buf;
    b->comp_size = b->uncomp_size = cp-buf;

    return b;
}